

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCircuit.hpp
# Opt level: O0

void __thiscall
qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::apply
          (QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_> *this,Op op,
          int nbQubits,vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *vector,
          int offset)

{
  bool bVar1;
  reference this_00;
  pointer pQVar2;
  reference this_01;
  undefined1 local_48 [8];
  undefined1 local_40 [8];
  const_reverse_iterator it_1;
  __normal_iterator<const_std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_*,_std::vector<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_>_>_>
  local_30;
  const_iterator it;
  int offset_local;
  vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *vector_local;
  int nbQubits_local;
  Op op_local;
  QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_> *this_local;
  
  it._M_current._4_4_ = offset;
  if (op == NoTrans) {
    local_30._M_current =
         (unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
          *)begin(this);
    while( true ) {
      it_1.current._M_current = end(this);
      bVar1 = __gnu_cxx::operator!=(&local_30,&it_1.current);
      if (!bVar1) break;
      this_00 = __gnu_cxx::
                __normal_iterator<const_std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_*,_std::vector<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_>_>_>
                ::operator*(&local_30);
      pQVar2 = std::
               unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
               ::operator->(this_00);
      (*pQVar2->_vptr_QObject[8])
                (pQVar2,0x4e,(ulong)(uint)nbQubits,vector,
                 (ulong)(uint)(this->offset_ + it._M_current._4_4_));
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_*,_std::vector<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_>_>_>
      ::operator++(&local_30);
    }
  }
  else {
    rbegin((QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_> *)local_40);
    while( true ) {
      rend((QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_> *)local_48);
      bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_*,_std::vector<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_>_>_>_>
                               *)local_40,
                              (reverse_iterator<__gnu_cxx::__normal_iterator<const_std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_*,_std::vector<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_>_>_>_>
                               *)local_48);
      if (!bVar1) break;
      this_01 = std::
                reverse_iterator<__gnu_cxx::__normal_iterator<const_std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_*,_std::vector<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_>_>_>_>
                ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_*,_std::vector<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_>_>_>_>
                             *)local_40);
      pQVar2 = std::
               unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
               ::operator->(this_01);
      (*pQVar2->_vptr_QObject[8])
                (pQVar2,(ulong)(uint)(int)(char)op,(ulong)(uint)nbQubits,vector,
                 (ulong)(uint)(this->offset_ + it._M_current._4_4_));
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<const_std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_*,_std::vector<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_*,_std::vector<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_>_>_>_>
                    *)local_40);
    }
  }
  return;
}

Assistant:

void apply( Op op , const int nbQubits , std::vector< T >& vector ,
                  const int offset = 0 ) const override {
        if ( op == Op::NoTrans ) {
          // NoTrans
          for ( auto it = begin(); it != end(); ++it ) {
            (*it)->apply( op , nbQubits , vector , offset_ + offset ) ;
          }
        } else {
          // [Conj]Trans
          for ( auto it = rbegin(); it != rend(); ++it ) {
            (*it)->apply( op , nbQubits , vector , offset_ + offset ) ;
          }
        }
      }